

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.cpp
# Opt level: O2

void __thiscall
Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::moveSampleList
          (TypedDeepImageChannel<Imath_3_2::half> *this,size_t i,uint oldNumSamples,
          uint newNumSamples,size_t newSampleListPosition)

{
  half *phVar1;
  half *phVar2;
  ulong uVar3;
  ulong uVar4;
  half **pphVar5;
  long lVar6;
  half *phVar7;
  bool bVar8;
  
  pphVar5 = this->_sampleListPointers;
  phVar7 = this->_sampleBuffer;
  phVar2 = pphVar5[i];
  phVar1 = phVar7 + newSampleListPosition;
  if (newNumSamples < oldNumSamples) {
    for (uVar3 = 0; newNumSamples != uVar3; uVar3 = uVar3 + 1) {
      phVar1[uVar3]._h = phVar2[uVar3]._h;
    }
  }
  else {
    uVar3 = (ulong)oldNumSamples;
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      phVar1[uVar4]._h = phVar2[uVar4]._h;
    }
    lVar6 = newNumSamples - uVar3;
    phVar7 = phVar7 + newSampleListPosition + uVar3;
    while (bVar8 = lVar6 != 0, lVar6 = lVar6 + -1, bVar8) {
      Imath_3_2::half::operator=(phVar7,0.0);
      phVar7 = phVar7 + 1;
    }
    pphVar5 = this->_sampleListPointers;
  }
  pphVar5[i] = phVar1;
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::moveSampleList (
    size_t       i,
    unsigned int oldNumSamples,
    unsigned int newNumSamples,
    size_t       newSampleListPosition)
{
    //
    // Resize the sample list for a single pixel and move it to a new
    // position in the sample buffer for this channel.
    //
    // i                        The position of the affected pixel in
    //                          the channel's _sampleListPointers.
    //
    // oldNumSamples            Original number of samples in sample list.
    //
    // newNumSamples            New number of samples in the sample list.
    //                          If the new number of samples is larger than
    //                          the old number of samples for a given sample
    //                          list, then the end of the new sample list
    //                          is filled with zeroes.  If the new number of
    //                          samples is smaller than the old one, then
    //                          samples at the end of the old sample list
    //                          are discarded.
    //
    // newSampleListPosition    The new position of the sample list in the
    //                          sample buffer.
    //

    T* oldSampleList = _sampleListPointers[i];
    T* newSampleList = _sampleBuffer + newSampleListPosition;

    if (oldNumSamples > newNumSamples)
    {
        for (unsigned int j = 0; j < newNumSamples; ++j)
            newSampleList[j] = oldSampleList[j];
    }
    else
    {
        for (unsigned int j = 0; j < oldNumSamples; ++j)
            newSampleList[j] = oldSampleList[j];

        for (unsigned int j = oldNumSamples; j < newNumSamples; ++j)
            newSampleList[j] = 0;
    }

    _sampleListPointers[i] = newSampleList;
}